

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_8::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  FdOutputStream::~FdOutputStream(&this->super_FdOutputStream);
  AutoCloseFd::~AutoCloseFd(&(this->super_DiskHandle).fd);
  ArrayOutputStream::~ArrayOutputStream
            ((ArrayOutputStream *)&(this->super_AppendableFile).super_OutputStream);
  operator_delete(this,0x30);
  return;
}

Assistant:

DiskAppendableFile(AutoCloseFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}